

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<7,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined1 *puVar1;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  int i;
  undefined4 *puVar4;
  float *pfVar5;
  undefined8 *puVar6;
  long lVar7;
  undefined4 *puVar8;
  Vec4 *pVVar9;
  undefined8 *puVar10;
  long lVar11;
  undefined1 *puVar12;
  bool bVar13;
  undefined4 *puVar14;
  undefined8 *puVar15;
  bool bVar16;
  int col;
  long lVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  float v;
  float fVar20;
  float fVar21;
  float v_3;
  float fVar22;
  undefined1 auVar23 [16];
  bool bVar25;
  float v_2;
  undefined4 uVar26;
  float fVar27;
  undefined1 auVar28 [16];
  Mat3 m;
  float afStack_100 [2];
  undefined1 local_f8 [16];
  float local_dc;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined8 local_c4;
  float local_bc;
  float local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined8 local_88;
  float afStack_80 [4];
  Matrix<float,_2,_2> retVal;
  undefined1 auStack_58 [8];
  Matrix<float,_2,_2> res_1;
  float fStack_40;
  float fStack_3c;
  float local_38 [4];
  Matrix<float,_2,_2> res;
  long lVar24;
  
  puVar4 = (undefined4 *)auStack_58;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar7 = 0;
    lVar11 = 0;
    do {
      lVar17 = 0;
      auVar23 = _DAT_00ac4b30;
      do {
        bVar25 = SUB164(auVar23 ^ _DAT_00ac4b80,4) == -0x80000000 &&
                 SUB164(auVar23 ^ _DAT_00ac4b80,0) < -0x7ffffffd;
        if (bVar25) {
          uVar26 = 0x3f800000;
          if (lVar7 != lVar17) {
            uVar26 = 0;
          }
          *(undefined4 *)((long)puVar4 + lVar17) = uVar26;
        }
        if (bVar25) {
          uVar26 = 0x3f800000;
          if (lVar7 + -0xc != lVar17) {
            uVar26 = 0;
          }
          *(undefined4 *)((long)puVar4 + lVar17 + 0xc) = uVar26;
        }
        lVar24 = auVar23._8_8_;
        auVar23._0_8_ = auVar23._0_8_ + 2;
        auVar23._8_8_ = lVar24 + 2;
        lVar17 = lVar17 + 0x18;
      } while (lVar17 != 0x30);
      lVar11 = lVar11 + 1;
      lVar7 = lVar7 + 0xc;
      puVar4 = puVar4 + 1;
    } while (lVar11 != 3);
    pVVar9 = evalCtx->in;
    auStack_58._4_4_ = evalCtx->in[0].m_data[1];
    res_1.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[2];
    res_1.m_data.m_data[0].m_data[1] = evalCtx->in[1].m_data[0];
    res_1.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[1];
    fStack_40 = evalCtx->in[2].m_data[0];
    fStack_3c = evalCtx->in[2].m_data[1];
    pfVar5 = evalCtx->in[2].m_data + 2;
    res_1.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[2];
  }
  else {
    res_1.m_data.m_data[1].m_data[0] = 0.0;
    res_1.m_data.m_data[1].m_data[1] = 0.0;
    auStack_58._0_4_ = 0.0;
    auStack_58._4_4_ = 0.0;
    res_1.m_data.m_data[0].m_data[0] = 0.0;
    res_1.m_data.m_data[0].m_data[1] = 0.0;
    local_38[0] = 0.0;
    puVar8 = &sr::(anonymous_namespace)::s_constInMat3x3;
    lVar7 = 0;
    do {
      lVar11 = 0;
      puVar14 = puVar4;
      do {
        *puVar14 = puVar8[lVar11];
        lVar11 = lVar11 + 1;
        puVar14 = puVar14 + 3;
      } while (lVar11 != 3);
      lVar7 = lVar7 + 1;
      puVar4 = puVar4 + 1;
      puVar8 = puVar8 + 3;
    } while (lVar7 != 3);
    pfVar5 = local_38;
    fStack_40 = 0.0;
    fStack_3c = 0.0;
    pVVar9 = (Vec4 *)auStack_58;
  }
  fVar21 = *pfVar5;
  puVar1 = local_f8 + 8;
  auVar28._0_4_ =
       pVVar9->m_data[0] * res_1.m_data.m_data[1].m_data[0] -
       res_1.m_data.m_data[0].m_data[1] * (float)auStack_58._4_4_;
  auVar19._0_8_ = CONCAT44(auStack_58._4_4_,res_1.m_data.m_data[1].m_data[0]) ^ 0x8000000000000000;
  auVar19._8_8_ = CONCAT44(pVVar9->m_data[0],res_1.m_data.m_data[0].m_data[1]) ^ 0x80000000;
  auVar28._4_4_ = auVar28._0_4_;
  auVar28._8_4_ = auVar28._0_4_;
  auVar28._12_4_ = auVar28._0_4_;
  local_f8 = divps(auVar19,auVar28);
  local_d8._0_4_ = 0x3f800000;
  local_98 = (undefined1  [8])((ulong)local_98 & 0xffffffff00000000);
  pfVar5 = (float *)local_d8;
  puVar12 = local_f8;
  bVar25 = true;
  do {
    bVar16 = bVar25;
    fVar20 = 0.0;
    lVar7 = 0;
    bVar25 = true;
    fVar22 = res_1.m_data.m_data[0].m_data[0];
    do {
      bVar18 = bVar25;
      fVar20 = fVar20 + fVar22 * *(float *)(puVar12 + lVar7 * 4);
      lVar7 = 1;
      bVar25 = false;
      fVar22 = res_1.m_data.m_data[1].m_data[1];
    } while (bVar18);
    *pfVar5 = fVar20;
    pfVar5 = (float *)local_98;
    puVar12 = puVar1;
    bVar25 = false;
  } while (bVar16);
  fVar20 = 0.0;
  pfVar5 = (float *)local_d8;
  bVar25 = true;
  fVar22 = fStack_40;
  do {
    bVar16 = bVar25;
    fVar20 = fVar20 + fVar22 * *pfVar5;
    pfVar5 = (float *)local_98;
    bVar25 = false;
    fVar22 = fStack_3c;
  } while (bVar16);
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  afStack_100[1] = 1.0;
  local_dc = 0.0;
  puVar12 = local_f8;
  pfVar5 = afStack_100 + 1;
  bVar25 = true;
  do {
    bVar16 = bVar25;
    fVar27 = 0.0;
    lVar7 = 0;
    bVar25 = true;
    fVar22 = fStack_40;
    do {
      bVar18 = bVar25;
      fVar27 = fVar27 + fVar22 * *(float *)(puVar12 + lVar7 * 8);
      lVar7 = 1;
      bVar25 = false;
      fVar22 = fStack_3c;
    } while (bVar18);
    *pfVar5 = fVar27;
    puVar12 = local_f8 + 4;
    pfVar5 = &local_dc;
    bVar25 = false;
  } while (bVar16);
  fVar21 = 1.0 / (fVar21 - fVar20);
  local_98._4_4_ = local_dc * fVar21 * res_1.m_data.m_data[0].m_data[0] + 0.0;
  local_98._0_4_ = afStack_100[1] * fVar21 * res_1.m_data.m_data[0].m_data[0] + 0.0;
  uStack_90 = CONCAT44(local_dc * fVar21 * res_1.m_data.m_data[1].m_data[1] + 0.0,
                       afStack_100[1] * fVar21 * res_1.m_data.m_data[1].m_data[1] + 0.0);
  local_d8 = (undefined1  [8])0x3f800000;
  uStack_d0 = 0x3f80000000000000;
  puVar6 = (undefined8 *)local_98;
  puVar10 = (undefined8 *)local_d8;
  bVar25 = true;
  do {
    bVar16 = bVar25;
    lVar7 = 0;
    puVar12 = local_f8;
    bVar25 = true;
    do {
      bVar18 = bVar25;
      fVar22 = 0.0;
      lVar11 = 0;
      bVar25 = true;
      do {
        bVar13 = bVar25;
        fVar22 = fVar22 + *(float *)(puVar6 + lVar11) * *(float *)(puVar12 + lVar11 * 4);
        lVar11 = 1;
        bVar25 = false;
      } while (bVar13);
      *(float *)(puVar10 + lVar7) = fVar22;
      lVar7 = 1;
      puVar12 = puVar1;
      bVar25 = false;
    } while (bVar18);
    puVar6 = (undefined8 *)((long)local_98 + 4);
    puVar10 = (undefined8 *)((long)local_d8 + 4);
    bVar25 = false;
  } while (bVar16);
  local_a8 = CONCAT44(local_d8._4_4_ + local_f8._4_4_,local_d8._0_4_ + local_f8._0_4_);
  uStack_a0 = CONCAT44((float)((ulong)uStack_d0 >> 0x20) + local_f8._12_4_,
                       (float)uStack_d0 + local_f8._8_4_);
  local_d8 = (undefined1  [8])CONCAT44(0.0 - local_f8._4_4_,0.0 - local_f8._0_4_);
  uStack_d0 = CONCAT44(0.0 - local_f8._12_4_,0.0 - local_f8._8_4_);
  local_98._0_4_ = 1.0;
  afStack_100[1] = 0.0;
  puVar6 = (undefined8 *)local_d8;
  pfVar5 = (float *)local_98;
  bVar25 = true;
  do {
    bVar16 = bVar25;
    fVar20 = 0.0;
    lVar7 = 0;
    bVar25 = true;
    fVar22 = fStack_40;
    do {
      bVar18 = bVar25;
      fVar20 = fVar20 + fVar22 * *(float *)(puVar6 + lVar7);
      lVar7 = 1;
      bVar25 = false;
      fVar22 = fStack_3c;
    } while (bVar18);
    *pfVar5 = fVar20;
    uVar26 = local_98._0_4_;
    puVar6 = (undefined8 *)((long)local_d8 + 4);
    pfVar5 = afStack_100 + 1;
    bVar25 = false;
  } while (bVar16);
  local_d8._0_4_ = 0x3f800000;
  local_98 = (undefined1  [8])((ulong)(uint)local_98._4_4_ << 0x20);
  pfVar5 = (float *)local_d8;
  puVar12 = local_f8;
  bVar25 = true;
  do {
    bVar16 = bVar25;
    fVar20 = 0.0;
    lVar7 = 0;
    bVar25 = true;
    fVar22 = res_1.m_data.m_data[0].m_data[0];
    do {
      bVar18 = bVar25;
      fVar20 = fVar20 + fVar22 * *(float *)(puVar12 + lVar7 * 4);
      lVar7 = 1;
      bVar25 = false;
      fVar22 = res_1.m_data.m_data[1].m_data[1];
    } while (bVar18);
    *pfVar5 = fVar20;
    pfVar5 = (float *)local_98;
    puVar12 = puVar1;
    bVar25 = false;
  } while (bVar16);
  puVar6 = (undefined8 *)local_98;
  puVar10 = (undefined8 *)local_d8;
  uVar3 = local_d8._0_4_;
  local_d8 = (undefined1  [8])CONCAT44((undefined4)uStack_a0,(int)local_a8);
  uStack_d0 = CONCAT44(local_a8._4_4_,(float)uVar26 * fVar21);
  local_c8 = uStack_a0._4_4_;
  local_c4 = CONCAT44(-fVar21 * (float)uVar3,afStack_100[1] * fVar21);
  local_bc = (float)local_98._0_4_ * -fVar21;
  local_b8 = fVar21;
  local_98 = (undefined1  [8])0x0;
  uStack_90 = 0;
  local_88 = 0;
  afStack_80[0] = 0.0;
  afStack_80[1] = 0.0;
  afStack_80[2] = 0.0;
  lVar7 = 0;
  do {
    lVar11 = 0;
    puVar15 = puVar6;
    do {
      *(undefined4 *)puVar15 = *(undefined4 *)((long)puVar10 + lVar11 * 4);
      lVar11 = lVar11 + 1;
      puVar15 = (undefined8 *)((long)puVar15 + 0xc);
    } while (lVar11 != 3);
    lVar7 = lVar7 + 1;
    puVar6 = (undefined8 *)((long)puVar6 + 4);
    puVar10 = (undefined8 *)((long)puVar10 + 0xc);
  } while (lVar7 != 3);
  uStack_d0 = (ulong)local_a8._4_4_ << 0x20;
  local_d8 = (undefined1  [8])0x0;
  lVar7 = 0;
  do {
    *(float *)((long)local_d8 + lVar7 * 4) =
         *(float *)((long)local_98 + lVar7 * 4) + *(float *)((long)&uStack_90 + lVar7 * 4 + 4);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  local_f8._8_4_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_f8._8_8_;
  local_f8 = auVar2 << 0x40;
  lVar7 = 0;
  do {
    *(float *)(local_f8 + lVar7 * 4) = *(float *)((long)local_d8 + lVar7 * 4) + afStack_80[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  uStack_d0 = 0x100000000;
  local_c8 = 2;
  lVar7 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)local_d8 + lVar7 * 4)] = afStack_100[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(inverse(in0));
	}